

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_spike.cpp
# Opt level: O2

int AF_A_ThrustImpale(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DAngle angle;
  VM_UBYTE VVar1;
  DObject *this;
  double dVar2;
  bool bVar3;
  int damage;
  AActor *origin;
  char *__assertion;
  CheckResult cres;
  FPortalGroupArray check;
  FMultiBlockThingsIterator it;
  FName local_22c;
  undefined8 local_228;
  CheckResult local_220;
  FPortalGroupArray local_1f8;
  FMultiBlockThingsIterator local_1d0;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00544100;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    origin = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (origin == (AActor *)0x0) {
LAB_00543ef0:
        origin = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00544100;
        }
      }
      if (numparam == 1) goto LAB_00543f70;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005440f0;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00544100;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_005440f0;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00543f70:
        local_1f8.data.Array = (unsigned_short *)0x0;
        local_1f8.data.Most = 0;
        local_1f8.data.Count = 0;
        local_1f8.method = 1;
        local_1f8.varused = '\0';
        local_1f8.inited = false;
        FMultiBlockThingsIterator::FMultiBlockThingsIterator
                  (&local_1d0,&local_1f8,origin,-1.0,false);
        while( true ) {
          bVar3 = FMultiBlockThingsIterator::Next(&local_1d0,&local_220);
          if (!bVar3) break;
          dVar2 = origin->radius + (local_220.thing)->radius;
          if ((ABS(((local_220.thing)->__Pos).X - local_220.Position.X) < dVar2) &&
             (ABS(((local_220.thing)->__Pos).Y - local_220.Position.Y) < dVar2)) {
            angle.Degrees = ((local_220.thing)->__Pos).Z;
            dVar2 = (origin->__Pos).Z;
            if ((((dVar2 <= (local_220.thing)->Height + angle.Degrees) &&
                 (angle.Degrees <= dVar2 + origin->Height)) ||
                (origin->Sector->PortalGroup == (local_220.thing)->Sector->PortalGroup)) &&
               ((local_220.thing != origin && ((((local_220.thing)->flags).Value & 4) != 0)))) {
              local_22c.Index = 0x8b;
              local_228 = 0;
              damage = P_DamageMobj(local_220.thing,origin,origin,0x2711,&local_22c,0,angle);
              if (damage < 1) {
                damage = 0x2711;
              }
              P_TraceBleed(damage,local_220.thing);
              origin->args[1] = 1;
            }
          }
        }
        TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
                  (&local_1d0.blockIterator.DynHash);
        TArray<unsigned_short,_unsigned_short>::~TArray(&local_1f8.data);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00544100;
    }
    if (origin == (AActor *)0x0) goto LAB_00543ef0;
  }
LAB_005440f0:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00544100:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                ,0x9a,"int AF_A_ThrustImpale(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ThrustImpale)
{
	PARAM_ACTION_PROLOGUE;

	// This doesn't need to iterate through portals.

	FPortalGroupArray check;
	FMultiBlockThingsIterator it(check, self);
	FMultiBlockThingsIterator::CheckResult cres;
	while (it.Next(&cres))
	{
		double blockdist = self->radius + cres.thing->radius;
		if (fabs(cres.thing->X() - cres.Position.X) >= blockdist || fabs(cres.thing->Y() - cres.Position.Y) >= blockdist)
			continue;

		// Q: Make this z-aware for everything? It never was before.
		if (cres.thing->Top() < self->Z() || cres.thing->Z() > self->Top())
		{
			if (self->Sector->PortalGroup != cres.thing->Sector->PortalGroup)
				continue;
		}

		if (!(cres.thing->flags & MF_SHOOTABLE) )
			continue;

		if (cres.thing == self)
			continue;	// don't clip against self

		int newdam = P_DamageMobj (cres.thing, self, self, 10001, NAME_Crush);
		P_TraceBleed (newdam > 0 ? newdam : 10001, cres.thing);
		self->args[1] = 1;	// Mark thrust thing as bloody
	}
	return 0;
}